

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O3

char * soundfile_strerror(int errnum)

{
  char *pcVar1;
  
  if (errnum + 0x3ebU < 4) {
    return (&PTR_anon_var_dwarf_11495_001e8aa0)[errnum + 0x3ebU];
  }
  pcVar1 = strerror(errnum);
  return pcVar1;
}

Assistant:

const char* soundfile_strerror(int errnum)
{
    switch (errnum)
    {
        case SOUNDFILE_ERRUNKNOWN:
            return "unknown header format";
        case SOUNDFILE_ERRMALFORMED:
            return "bad header format";
        case SOUNDFILE_ERRVERSION:
            return "unsupported header format version";
        case SOUNDFILE_ERRSAMPLEFMT:
            return "unsupported sample format";
        default: /* C/POSIX error */
            return strerror(errnum);
    }
}